

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

utf8_size_t utf8_trimmed_length(utf8_char_t *data,utf8_size_t charcters)

{
  long lVar1;
  int iVar2;
  size_t c;
  ulong uVar3;
  utf8_size_t uVar4;
  utf8_size_t uVar5;
  
  uVar4 = 0;
  uVar5 = 0;
  for (uVar3 = 0; (*data != 0 && (uVar3 < charcters)); uVar3 = uVar3 + 1) {
    lVar1 = *(long *)((long)utf8_char_length::_utf8_char_length + (ulong)((byte)*data & 0xfffffff8))
    ;
    iVar2 = utf8_char_whitespace(data);
    uVar4 = uVar4 + lVar1;
    if (iVar2 == 0) {
      uVar5 = uVar4;
    }
    data = (utf8_char_t *)((byte *)data + lVar1);
  }
  return uVar5;
}

Assistant:

size_t utf8_trimmed_length(const utf8_char_t* data, utf8_size_t charcters)
{
    size_t l, t = 0, split_at = 0;
    for (size_t c = 0; (*data) && c < charcters; ++c) {
        l = utf8_char_length(data);
        if (!utf8_char_whitespace(data)) {
            split_at = t + l;
        }
         t += l, data += l;
    }

    return split_at;
}